

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::getString(Value *this,char **begin,char **end)

{
  bool isPrefixed;
  ValueType VVar1;
  uint local_2c;
  char **ppcStack_28;
  uint length;
  char **end_local;
  char **begin_local;
  Value *this_local;
  
  ppcStack_28 = end;
  end_local = begin;
  begin_local = (char **)this;
  VVar1 = type(this);
  if (VVar1 == stringValue) {
    if ((this->value_).int_ == 0) {
      this_local._7_1_ = false;
    }
    else {
      isPrefixed = isAllocated(this);
      decodePrefixedString(isPrefixed,(this->value_).string_,&local_2c,end_local);
      *ppcStack_28 = *end_local + local_2c;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::getString(char const** begin, char const** end) const {
  if (type() != stringValue)
    return false;
  if (value_.string_ == nullptr)
    return false;
  unsigned length;
  decodePrefixedString(this->isAllocated(), this->value_.string_, &length,
                       begin);
  *end = *begin + length;
  return true;
}